

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O0

void __thiscall
vkt::api::anon_unknown_1::PipelineLayout::Resources::Resources
          (Resources *this,Environment *env,Parameters *params)

{
  bool bVar1;
  Dependency<vkt::api::(anonymous_namespace)::DescriptorSetLayout> *pDVar2;
  reference params_00;
  reference this_00;
  Handle<(vk::HandleType)19> *__x;
  SharedPtr<vkt::api::(anonymous_namespace)::Dependency<vkt::api::(anonymous_namespace)::DescriptorSetLayout>_>
  local_40;
  __normal_iterator<const_vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters_*,_std::vector<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters>_>_>
  local_30;
  __normal_iterator<const_vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters_*,_std::vector<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters>_>_>
  local_28;
  const_iterator dsParams;
  Parameters *params_local;
  Environment *env_local;
  Resources *this_local;
  
  dsParams._M_current = (Parameters *)params;
  std::
  vector<de::SharedPtr<vkt::api::(anonymous_namespace)::Dependency<vkt::api::(anonymous_namespace)::DescriptorSetLayout>_>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::Dependency<vkt::api::(anonymous_namespace)::DescriptorSetLayout>_>_>_>
  ::vector(&this->descriptorSetLayouts);
  std::vector<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>::
  vector(&this->pSetLayouts);
  local_28._M_current =
       (Parameters *)
       std::
       vector<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters>_>
       ::begin((vector<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters>_>
                *)dsParams._M_current);
  while( true ) {
    local_30._M_current =
         (Parameters *)
         std::
         vector<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters>_>
         ::end((vector<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters>_>
                *)dsParams._M_current);
    bVar1 = __gnu_cxx::operator!=(&local_28,&local_30);
    if (!bVar1) break;
    pDVar2 = (Dependency<vkt::api::(anonymous_namespace)::DescriptorSetLayout> *)operator_new(0x60);
    params_00 = __gnu_cxx::
                __normal_iterator<const_vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters_*,_std::vector<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters>_>_>
                ::operator*(&local_28);
    Dependency<vkt::api::(anonymous_namespace)::DescriptorSetLayout>::Dependency
              (pDVar2,env,params_00);
    de::
    SharedPtr<vkt::api::(anonymous_namespace)::Dependency<vkt::api::(anonymous_namespace)::DescriptorSetLayout>_>
    ::SharedPtr(&local_40,pDVar2);
    std::
    vector<de::SharedPtr<vkt::api::(anonymous_namespace)::Dependency<vkt::api::(anonymous_namespace)::DescriptorSetLayout>_>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::Dependency<vkt::api::(anonymous_namespace)::DescriptorSetLayout>_>_>_>
    ::push_back(&this->descriptorSetLayouts,&local_40);
    de::
    SharedPtr<vkt::api::(anonymous_namespace)::Dependency<vkt::api::(anonymous_namespace)::DescriptorSetLayout>_>
    ::~SharedPtr(&local_40);
    this_00 = std::
              vector<de::SharedPtr<vkt::api::(anonymous_namespace)::Dependency<vkt::api::(anonymous_namespace)::DescriptorSetLayout>_>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::Dependency<vkt::api::(anonymous_namespace)::DescriptorSetLayout>_>_>_>
              ::back(&this->descriptorSetLayouts);
    pDVar2 = de::
             SharedPtr<vkt::api::(anonymous_namespace)::Dependency<vkt::api::(anonymous_namespace)::DescriptorSetLayout>_>
             ::operator->(this_00);
    __x = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::operator*
                    (&(pDVar2->object).super_RefBase<vk::Handle<(vk::HandleType)19>_>);
    std::vector<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>::
    push_back(&this->pSetLayouts,__x);
    __gnu_cxx::
    __normal_iterator<const_vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters_*,_std::vector<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters>_>_>
    ::operator++(&local_28);
  }
  return;
}

Assistant:

Resources (const Environment& env, const Parameters& params)
		{
			for (vector<DescriptorSetLayout::Parameters>::const_iterator dsParams = params.descriptorSetLayouts.begin();
				 dsParams != params.descriptorSetLayouts.end();
				 ++dsParams)
			{
				descriptorSetLayouts.push_back(DescriptorSetLayoutDepSp(new Dependency<DescriptorSetLayout>(env, *dsParams)));
				pSetLayouts.push_back(*descriptorSetLayouts.back()->object);
			}
		}